

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
zeGetCommandListProcAddrTable(ze_api_version_t version,ze_command_list_dditable_t *pDdiTable)

{
  ze_api_version_t *pzVar1;
  ze_result_t zVar2;
  
  pzVar1 = validation_layer::context;
  if (pDdiTable == (ze_command_list_dditable_t *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar2 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      *(ze_pfnCommandListCreate_t *)(validation_layer::context + 0x86) = pDdiTable->pfnCreate;
      pDdiTable->pfnCreate = validation_layer::zeCommandListCreate;
      *(ze_pfnCommandListCreateImmediate_t *)(pzVar1 + 0x88) = pDdiTable->pfnCreateImmediate;
      pDdiTable->pfnCreateImmediate = validation_layer::zeCommandListCreateImmediate;
      *(ze_pfnCommandListDestroy_t *)(pzVar1 + 0x8a) = pDdiTable->pfnDestroy;
      pDdiTable->pfnDestroy = validation_layer::zeCommandListDestroy;
      *(ze_pfnCommandListClose_t *)(pzVar1 + 0x8c) = pDdiTable->pfnClose;
      pDdiTable->pfnClose = validation_layer::zeCommandListClose;
      *(ze_pfnCommandListReset_t *)(pzVar1 + 0x8e) = pDdiTable->pfnReset;
      pDdiTable->pfnReset = validation_layer::zeCommandListReset;
      *(ze_pfnCommandListAppendWriteGlobalTimestamp_t *)(pzVar1 + 0x90) =
           pDdiTable->pfnAppendWriteGlobalTimestamp;
      pDdiTable->pfnAppendWriteGlobalTimestamp =
           validation_layer::zeCommandListAppendWriteGlobalTimestamp;
      *(ze_pfnCommandListAppendBarrier_t *)(pzVar1 + 0x92) = pDdiTable->pfnAppendBarrier;
      pDdiTable->pfnAppendBarrier = validation_layer::zeCommandListAppendBarrier;
      *(ze_pfnCommandListAppendMemoryRangesBarrier_t *)(pzVar1 + 0x94) =
           pDdiTable->pfnAppendMemoryRangesBarrier;
      pDdiTable->pfnAppendMemoryRangesBarrier =
           validation_layer::zeCommandListAppendMemoryRangesBarrier;
      *(ze_pfnCommandListAppendMemoryCopy_t *)(pzVar1 + 0x96) = pDdiTable->pfnAppendMemoryCopy;
      pDdiTable->pfnAppendMemoryCopy = validation_layer::zeCommandListAppendMemoryCopy;
      *(ze_pfnCommandListAppendMemoryFill_t *)(pzVar1 + 0x98) = pDdiTable->pfnAppendMemoryFill;
      pDdiTable->pfnAppendMemoryFill = validation_layer::zeCommandListAppendMemoryFill;
      *(ze_pfnCommandListAppendMemoryCopyRegion_t *)(pzVar1 + 0x9a) =
           pDdiTable->pfnAppendMemoryCopyRegion;
      pDdiTable->pfnAppendMemoryCopyRegion = validation_layer::zeCommandListAppendMemoryCopyRegion;
      *(ze_pfnCommandListAppendMemoryCopyFromContext_t *)(pzVar1 + 0x9c) =
           pDdiTable->pfnAppendMemoryCopyFromContext;
      pDdiTable->pfnAppendMemoryCopyFromContext =
           validation_layer::zeCommandListAppendMemoryCopyFromContext;
      *(ze_pfnCommandListAppendImageCopy_t *)(pzVar1 + 0x9e) = pDdiTable->pfnAppendImageCopy;
      pDdiTable->pfnAppendImageCopy = validation_layer::zeCommandListAppendImageCopy;
      *(ze_pfnCommandListAppendImageCopyRegion_t *)(pzVar1 + 0xa0) =
           pDdiTable->pfnAppendImageCopyRegion;
      pDdiTable->pfnAppendImageCopyRegion = validation_layer::zeCommandListAppendImageCopyRegion;
      *(ze_pfnCommandListAppendImageCopyToMemory_t *)(pzVar1 + 0xa2) =
           pDdiTable->pfnAppendImageCopyToMemory;
      pDdiTable->pfnAppendImageCopyToMemory = validation_layer::zeCommandListAppendImageCopyToMemory
      ;
      *(ze_pfnCommandListAppendImageCopyFromMemory_t *)(pzVar1 + 0xa4) =
           pDdiTable->pfnAppendImageCopyFromMemory;
      pDdiTable->pfnAppendImageCopyFromMemory =
           validation_layer::zeCommandListAppendImageCopyFromMemory;
      *(ze_pfnCommandListAppendMemoryPrefetch_t *)(pzVar1 + 0xa6) =
           pDdiTable->pfnAppendMemoryPrefetch;
      pDdiTable->pfnAppendMemoryPrefetch = validation_layer::zeCommandListAppendMemoryPrefetch;
      *(ze_pfnCommandListAppendMemAdvise_t *)(pzVar1 + 0xa8) = pDdiTable->pfnAppendMemAdvise;
      pDdiTable->pfnAppendMemAdvise = validation_layer::zeCommandListAppendMemAdvise;
      *(ze_pfnCommandListAppendSignalEvent_t *)(pzVar1 + 0xaa) = pDdiTable->pfnAppendSignalEvent;
      pDdiTable->pfnAppendSignalEvent = validation_layer::zeCommandListAppendSignalEvent;
      *(ze_pfnCommandListAppendWaitOnEvents_t *)(pzVar1 + 0xac) = pDdiTable->pfnAppendWaitOnEvents;
      pDdiTable->pfnAppendWaitOnEvents = validation_layer::zeCommandListAppendWaitOnEvents;
      *(ze_pfnCommandListAppendEventReset_t *)(pzVar1 + 0xae) = pDdiTable->pfnAppendEventReset;
      pDdiTable->pfnAppendEventReset = validation_layer::zeCommandListAppendEventReset;
      *(ze_pfnCommandListAppendQueryKernelTimestamps_t *)(pzVar1 + 0xb0) =
           pDdiTable->pfnAppendQueryKernelTimestamps;
      pDdiTable->pfnAppendQueryKernelTimestamps =
           validation_layer::zeCommandListAppendQueryKernelTimestamps;
      *(ze_pfnCommandListAppendLaunchKernel_t *)(pzVar1 + 0xb2) = pDdiTable->pfnAppendLaunchKernel;
      pDdiTable->pfnAppendLaunchKernel = validation_layer::zeCommandListAppendLaunchKernel;
      *(ze_pfnCommandListAppendLaunchCooperativeKernel_t *)(pzVar1 + 0xb4) =
           pDdiTable->pfnAppendLaunchCooperativeKernel;
      pDdiTable->pfnAppendLaunchCooperativeKernel =
           validation_layer::zeCommandListAppendLaunchCooperativeKernel;
      *(ze_pfnCommandListAppendLaunchKernelIndirect_t *)(pzVar1 + 0xb6) =
           pDdiTable->pfnAppendLaunchKernelIndirect;
      pDdiTable->pfnAppendLaunchKernelIndirect =
           validation_layer::zeCommandListAppendLaunchKernelIndirect;
      *(ze_pfnCommandListAppendLaunchMultipleKernelsIndirect_t *)(pzVar1 + 0xb8) =
           pDdiTable->pfnAppendLaunchMultipleKernelsIndirect;
      pDdiTable->pfnAppendLaunchMultipleKernelsIndirect =
           validation_layer::zeCommandListAppendLaunchMultipleKernelsIndirect;
      *(ze_pfnCommandListAppendSignalExternalSemaphoreExt_t *)(pzVar1 + 0xca) =
           pDdiTable->pfnAppendSignalExternalSemaphoreExt;
      pDdiTable->pfnAppendSignalExternalSemaphoreExt =
           validation_layer::zeCommandListAppendSignalExternalSemaphoreExt;
      *(ze_pfnCommandListAppendWaitExternalSemaphoreExt_t *)(pzVar1 + 0xcc) =
           pDdiTable->pfnAppendWaitExternalSemaphoreExt;
      pDdiTable->pfnAppendWaitExternalSemaphoreExt =
           validation_layer::zeCommandListAppendWaitExternalSemaphoreExt;
      *(ze_pfnCommandListAppendImageCopyToMemoryExt_t *)(pzVar1 + 0xba) =
           pDdiTable->pfnAppendImageCopyToMemoryExt;
      pDdiTable->pfnAppendImageCopyToMemoryExt =
           validation_layer::zeCommandListAppendImageCopyToMemoryExt;
      *(ze_pfnCommandListAppendImageCopyFromMemoryExt_t *)(pzVar1 + 0xbc) =
           pDdiTable->pfnAppendImageCopyFromMemoryExt;
      pDdiTable->pfnAppendImageCopyFromMemoryExt =
           validation_layer::zeCommandListAppendImageCopyFromMemoryExt;
      *(ze_pfnCommandListHostSynchronize_t *)(pzVar1 + 0xbe) = pDdiTable->pfnHostSynchronize;
      pDdiTable->pfnHostSynchronize = validation_layer::zeCommandListHostSynchronize;
      *(ze_pfnCommandListGetDeviceHandle_t *)(pzVar1 + 0xc0) = pDdiTable->pfnGetDeviceHandle;
      pDdiTable->pfnGetDeviceHandle = validation_layer::zeCommandListGetDeviceHandle;
      *(ze_pfnCommandListGetContextHandle_t *)(pzVar1 + 0xc2) = pDdiTable->pfnGetContextHandle;
      pDdiTable->pfnGetContextHandle = validation_layer::zeCommandListGetContextHandle;
      *(ze_pfnCommandListGetOrdinal_t *)(pzVar1 + 0xc4) = pDdiTable->pfnGetOrdinal;
      pDdiTable->pfnGetOrdinal = validation_layer::zeCommandListGetOrdinal;
      *(ze_pfnCommandListImmediateGetIndex_t *)(pzVar1 + 0xc6) = pDdiTable->pfnImmediateGetIndex;
      pDdiTable->pfnImmediateGetIndex = validation_layer::zeCommandListImmediateGetIndex;
      *(ze_pfnCommandListIsImmediate_t *)(pzVar1 + 200) = pDdiTable->pfnIsImmediate;
      pDdiTable->pfnIsImmediate = validation_layer::zeCommandListIsImmediate;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetCommandListProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_command_list_dditable_t* pDdiTable           ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.CommandList;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = validation_layer::zeCommandListCreate;

    dditable.pfnCreateImmediate                          = pDdiTable->pfnCreateImmediate;
    pDdiTable->pfnCreateImmediate                        = validation_layer::zeCommandListCreateImmediate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = validation_layer::zeCommandListDestroy;

    dditable.pfnClose                                    = pDdiTable->pfnClose;
    pDdiTable->pfnClose                                  = validation_layer::zeCommandListClose;

    dditable.pfnReset                                    = pDdiTable->pfnReset;
    pDdiTable->pfnReset                                  = validation_layer::zeCommandListReset;

    dditable.pfnAppendWriteGlobalTimestamp               = pDdiTable->pfnAppendWriteGlobalTimestamp;
    pDdiTable->pfnAppendWriteGlobalTimestamp             = validation_layer::zeCommandListAppendWriteGlobalTimestamp;

    dditable.pfnAppendBarrier                            = pDdiTable->pfnAppendBarrier;
    pDdiTable->pfnAppendBarrier                          = validation_layer::zeCommandListAppendBarrier;

    dditable.pfnAppendMemoryRangesBarrier                = pDdiTable->pfnAppendMemoryRangesBarrier;
    pDdiTable->pfnAppendMemoryRangesBarrier              = validation_layer::zeCommandListAppendMemoryRangesBarrier;

    dditable.pfnAppendMemoryCopy                         = pDdiTable->pfnAppendMemoryCopy;
    pDdiTable->pfnAppendMemoryCopy                       = validation_layer::zeCommandListAppendMemoryCopy;

    dditable.pfnAppendMemoryFill                         = pDdiTable->pfnAppendMemoryFill;
    pDdiTable->pfnAppendMemoryFill                       = validation_layer::zeCommandListAppendMemoryFill;

    dditable.pfnAppendMemoryCopyRegion                   = pDdiTable->pfnAppendMemoryCopyRegion;
    pDdiTable->pfnAppendMemoryCopyRegion                 = validation_layer::zeCommandListAppendMemoryCopyRegion;

    dditable.pfnAppendMemoryCopyFromContext              = pDdiTable->pfnAppendMemoryCopyFromContext;
    pDdiTable->pfnAppendMemoryCopyFromContext            = validation_layer::zeCommandListAppendMemoryCopyFromContext;

    dditable.pfnAppendImageCopy                          = pDdiTable->pfnAppendImageCopy;
    pDdiTable->pfnAppendImageCopy                        = validation_layer::zeCommandListAppendImageCopy;

    dditable.pfnAppendImageCopyRegion                    = pDdiTable->pfnAppendImageCopyRegion;
    pDdiTable->pfnAppendImageCopyRegion                  = validation_layer::zeCommandListAppendImageCopyRegion;

    dditable.pfnAppendImageCopyToMemory                  = pDdiTable->pfnAppendImageCopyToMemory;
    pDdiTable->pfnAppendImageCopyToMemory                = validation_layer::zeCommandListAppendImageCopyToMemory;

    dditable.pfnAppendImageCopyFromMemory                = pDdiTable->pfnAppendImageCopyFromMemory;
    pDdiTable->pfnAppendImageCopyFromMemory              = validation_layer::zeCommandListAppendImageCopyFromMemory;

    dditable.pfnAppendMemoryPrefetch                     = pDdiTable->pfnAppendMemoryPrefetch;
    pDdiTable->pfnAppendMemoryPrefetch                   = validation_layer::zeCommandListAppendMemoryPrefetch;

    dditable.pfnAppendMemAdvise                          = pDdiTable->pfnAppendMemAdvise;
    pDdiTable->pfnAppendMemAdvise                        = validation_layer::zeCommandListAppendMemAdvise;

    dditable.pfnAppendSignalEvent                        = pDdiTable->pfnAppendSignalEvent;
    pDdiTable->pfnAppendSignalEvent                      = validation_layer::zeCommandListAppendSignalEvent;

    dditable.pfnAppendWaitOnEvents                       = pDdiTable->pfnAppendWaitOnEvents;
    pDdiTable->pfnAppendWaitOnEvents                     = validation_layer::zeCommandListAppendWaitOnEvents;

    dditable.pfnAppendEventReset                         = pDdiTable->pfnAppendEventReset;
    pDdiTable->pfnAppendEventReset                       = validation_layer::zeCommandListAppendEventReset;

    dditable.pfnAppendQueryKernelTimestamps              = pDdiTable->pfnAppendQueryKernelTimestamps;
    pDdiTable->pfnAppendQueryKernelTimestamps            = validation_layer::zeCommandListAppendQueryKernelTimestamps;

    dditable.pfnAppendLaunchKernel                       = pDdiTable->pfnAppendLaunchKernel;
    pDdiTable->pfnAppendLaunchKernel                     = validation_layer::zeCommandListAppendLaunchKernel;

    dditable.pfnAppendLaunchCooperativeKernel            = pDdiTable->pfnAppendLaunchCooperativeKernel;
    pDdiTable->pfnAppendLaunchCooperativeKernel          = validation_layer::zeCommandListAppendLaunchCooperativeKernel;

    dditable.pfnAppendLaunchKernelIndirect               = pDdiTable->pfnAppendLaunchKernelIndirect;
    pDdiTable->pfnAppendLaunchKernelIndirect             = validation_layer::zeCommandListAppendLaunchKernelIndirect;

    dditable.pfnAppendLaunchMultipleKernelsIndirect      = pDdiTable->pfnAppendLaunchMultipleKernelsIndirect;
    pDdiTable->pfnAppendLaunchMultipleKernelsIndirect    = validation_layer::zeCommandListAppendLaunchMultipleKernelsIndirect;

    dditable.pfnAppendSignalExternalSemaphoreExt         = pDdiTable->pfnAppendSignalExternalSemaphoreExt;
    pDdiTable->pfnAppendSignalExternalSemaphoreExt       = validation_layer::zeCommandListAppendSignalExternalSemaphoreExt;

    dditable.pfnAppendWaitExternalSemaphoreExt           = pDdiTable->pfnAppendWaitExternalSemaphoreExt;
    pDdiTable->pfnAppendWaitExternalSemaphoreExt         = validation_layer::zeCommandListAppendWaitExternalSemaphoreExt;

    dditable.pfnAppendImageCopyToMemoryExt               = pDdiTable->pfnAppendImageCopyToMemoryExt;
    pDdiTable->pfnAppendImageCopyToMemoryExt             = validation_layer::zeCommandListAppendImageCopyToMemoryExt;

    dditable.pfnAppendImageCopyFromMemoryExt             = pDdiTable->pfnAppendImageCopyFromMemoryExt;
    pDdiTable->pfnAppendImageCopyFromMemoryExt           = validation_layer::zeCommandListAppendImageCopyFromMemoryExt;

    dditable.pfnHostSynchronize                          = pDdiTable->pfnHostSynchronize;
    pDdiTable->pfnHostSynchronize                        = validation_layer::zeCommandListHostSynchronize;

    dditable.pfnGetDeviceHandle                          = pDdiTable->pfnGetDeviceHandle;
    pDdiTable->pfnGetDeviceHandle                        = validation_layer::zeCommandListGetDeviceHandle;

    dditable.pfnGetContextHandle                         = pDdiTable->pfnGetContextHandle;
    pDdiTable->pfnGetContextHandle                       = validation_layer::zeCommandListGetContextHandle;

    dditable.pfnGetOrdinal                               = pDdiTable->pfnGetOrdinal;
    pDdiTable->pfnGetOrdinal                             = validation_layer::zeCommandListGetOrdinal;

    dditable.pfnImmediateGetIndex                        = pDdiTable->pfnImmediateGetIndex;
    pDdiTable->pfnImmediateGetIndex                      = validation_layer::zeCommandListImmediateGetIndex;

    dditable.pfnIsImmediate                              = pDdiTable->pfnIsImmediate;
    pDdiTable->pfnIsImmediate                            = validation_layer::zeCommandListIsImmediate;

    return result;
}